

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::OpenGeneric
          (TPZFileEqnStorage<std::complex<float>_> *this,char option,char *name)

{
  char *pcVar1;
  uint in_EAX;
  FILE *pFVar2;
  int iVar3;
  undefined7 in_register_00000031;
  int zero;
  undefined8 uStack_38;
  
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0xb;
  pcVar1 = (char *)(this->fFileName)._M_string_length;
  uStack_38._0_4_ = in_EAX;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&this->fFileName,0,pcVar1,(ulong)name);
  iVar3 = (int)CONCAT71(in_register_00000031,option);
  if (iVar3 == 0x77) {
    pFVar2 = fopen((this->fFileName)._M_dataplus._M_p,"wb");
    this->fIOStream = (FILE *)pFVar2;
    uStack_38 = (ulong)(uint)uStack_38;
    fwrite(&this->fNumHeaders,4,1,pFVar2);
    fwrite((void *)((long)&uStack_38 + 4),4,1,(FILE *)this->fIOStream);
  }
  else if (iVar3 == 0x72) {
    pFVar2 = fopen((this->fFileName)._M_dataplus._M_p,"rb");
    this->fIOStream = (FILE *)pFVar2;
    fread(&this->fNumHeaders,4,1,pFVar2);
    fread(&this->fNumBlocks,4,1,(FILE *)this->fIOStream);
    ReadBlockPositions(this);
    return;
  }
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::OpenGeneric(char option, const char * name)
{
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=11;

	fFileName = name;
	
	if(option=='r'){
		fIOStream = fopen(fFileName.c_str(),"rb"); //open for reading
		/**
		 *Opens binary files and get initial information
		 *use this information for storage requirements
		 */
		int64_t sizereturn;
		sizereturn = 0;
		sizereturn = fread(&fNumHeaders,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		sizereturn = fread(&fNumBlocks,sizeof(int),1,fIOStream);
#ifdef PZDEBUG
		if (sizereturn != 1) DebugStop();
#endif
		ReadBlockPositions();
	}else if(option=='w'){
		fIOStream = fopen(fFileName.c_str(),"wb"); //open for writing
		/**
		 *Writes NumHeaders and NumBlocks information in
		 *the two initial positions on fIOStream
		 */
		int zero = 0;
		fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
		fwrite(&zero,sizeof(int),1,fIOStream);
	}
}